

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessGenModeQueryCase::iterate(TessGenModeQueryCase *this)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  deUint32 program_00;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  Context *pCVar6;
  ProgramSources *pPVar7;
  string *description;
  char *pcVar8;
  allocator<char> local_471;
  string local_470;
  string local_450;
  string local_430;
  ShaderSource local_410;
  string local_3e8;
  string local_3c8;
  ShaderSource local_3a8;
  string local_380;
  string local_360;
  ShaderSource local_340;
  string local_318;
  string local_2f8;
  ShaderSource local_2d8;
  ProgramSources local_2b0;
  undefined1 local_1e0 [8];
  ShaderProgram program;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  ScopedLogSection local_c0;
  ScopedLogSection section;
  undefined1 local_b0 [4];
  int ndx;
  CallLogWrapper gl;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  ResultCollector result;
  TessGenModeQueryCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_81);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_60,pTVar4,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pRVar5 = Context::getRenderContext((this->super_TessProgramQueryCase).super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_b0,(Functions *)CONCAT44(extraout_var,iVar3),pTVar4);
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_b0,true);
  for (section.m_log._4_4_ = 0; section.m_log._4_4_ < 3;
      section.m_log._4_4_ = section.m_log._4_4_ + 1) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Type",&local_e1);
    pcVar8 = iterate::s_modes[section.m_log._4_4_].description;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,pcVar8,
               (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
    description = &local_108;
    tcu::ScopedLogSection::ScopedLogSection(&local_c0,pTVar4,&local_e0,description);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    pRVar5 = Context::getRenderContext((this->super_TessProgramQueryCase).super_TestCase.m_context);
    glu::ProgramSources::ProgramSources(&local_2b0);
    pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getVertexSource_abi_cxx11_(&local_318,this);
    pCVar6 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2f8,(_anonymous_namespace_ *)pCVar1,pCVar6,(char *)description);
    glu::VertexSource::VertexSource((VertexSource *)&local_2d8,&local_2f8);
    pPVar7 = glu::ProgramSources::operator<<(&local_2b0,&local_2d8);
    pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getFragmentSource_abi_cxx11_(&local_380,this);
    pCVar6 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_360,(_anonymous_namespace_ *)pCVar1,pCVar6,(char *)description);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_340,&local_360);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_340);
    pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
              (&local_3e8,this,"layout(vertices=6) out");
    pCVar6 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_3c8,(_anonymous_namespace_ *)pCVar1,pCVar6,(char *)description);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_3a8,&local_3c8);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_3a8);
    pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    pcVar8 = (char *)((long)section.m_log._4_4_ * 3);
    (anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
              (&local_450,this,iterate::s_modes[section.m_log._4_4_].layout);
    pCVar6 = (Context *)std::__cxx11::string::c_str();
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_430,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar8);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_410,&local_430);
    pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_410);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1e0,pRVar5,pPVar7);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    glu::VertexSource::~VertexSource((VertexSource *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    glu::ProgramSources::~ProgramSources(&local_2b0);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    glu::operator<<(pTVar4,(ShaderProgram *)local_1e0);
    bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_1e0);
    if (bVar2) {
      program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e0);
      gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_60,(CallLogWrapper *)local_b0,program_00,0x8e76,
                 iterate::s_modes[section.m_log._4_4_].mode,QUERY_PROGRAM_INTEGER);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"failed to build program",&local_471);
      tcu::ResultCollector::fail((ResultCollector *)local_60,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1e0);
    tcu::ScopedLogSection::~ScopedLogSection(&local_c0);
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_60,
             (this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_b0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_60);
  return STOP;
}

Assistant:

TessGenModeQueryCase::IterateResult TessGenModeQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	static const struct
	{
		const char* description;
		const char* layout;
		glw::GLenum mode;
	} s_modes[] =
	{
		{ "Triangles",	"layout(triangles) in",	GL_TRIANGLES	},
		{ "Isolines",	"layout(isolines) in",	GL_ISOLINES		},
		{ "Quads",		"layout(quads) in",		GL_QUADS		},
	};

	checkTessellationSupport(m_context);
	gl.enableLogging(true);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_modes); ++ndx)
	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Type", s_modes[ndx].description);

		glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=6) out").c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource(s_modes[ndx].layout).c_str())));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			result.fail("failed to build program");
		else
			verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, s_modes[ndx].mode, QUERY_PROGRAM_INTEGER);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}